

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void av1_set_fixed_partitioning
               (AV1_COMP *cpi,TileInfo *tile,MB_MODE_INFO **mib,int mi_row,int mi_col,
               BLOCK_SIZE bsize)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  MB_MODE_INFO *pMVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int mi_alloc_size_1d;
  uint uVar9;
  uint uVar10;
  int bh;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000089;
  int iVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  
  uVar17 = CONCAT71(in_register_00000089,bsize);
  iVar18 = tile->mi_row_end - mi_row;
  iVar20 = tile->mi_col_end - mi_col;
  iVar2 = (cpi->common).mi_params.mi_alloc_stride;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [(cpi->common).mi_params.mi_alloc_bsize];
  uVar9 = (uint)bVar1;
  iVar12 = (mi_row / (int)(uint)bVar1) * iVar2 + mi_col / (int)(uint)bVar1;
  uVar11 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar17 & 0xffffffff];
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [uVar17 & 0xffffffff];
  uVar15 = ((cpi->common).seq_params)->mib_size;
  uVar7 = (ulong)uVar15;
  pMVar4 = (cpi->common).mi_params.mi_alloc;
  if (iVar18 < (int)uVar15 || iVar20 < (int)uVar15) {
    if (0 < (int)uVar15) {
      uVar15 = 3;
      if (bsize < 3) {
        uVar15 = (uint)bsize;
      }
      iVar13 = 0;
      do {
        if (0 < (int)uVar7) {
          iVar3 = (cpi->common).mi_params.mi_stride;
          iVar8 = iVar18 - iVar13;
          iVar16 = 0;
          uVar19 = (uint)bVar1;
          do {
            uVar14 = 0;
            if (iVar20 <= iVar16 || 0 >= iVar8) {
              uVar14 = uVar15;
            }
            mib[iVar3 * iVar13 + iVar16] =
                 pMVar4 + (long)iVar12 + (long)(iVar16 / (int)uVar9 + (iVar13 / (int)uVar9) * iVar2)
            ;
            uVar17 = uVar17 & 0xffffffff;
            if (((char)uVar17 != '\0') && (uVar10 = (uint)bsize, iVar16 < iVar20 && 0 < iVar8)) {
              do {
                uVar11 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [uVar10];
                uVar19 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [uVar10];
                if (((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [uVar10] <= iVar8) &&
                   (uVar14 = uVar10, (int)uVar19 <= iVar20 - iVar16)) break;
                uVar14 = uVar10 - 3;
                bVar5 = 3 < (int)uVar10;
                uVar10 = uVar14;
              } while (bVar5);
            }
            pMVar4[(long)iVar12 + (long)(iVar16 / (int)uVar9 + (iVar13 / (int)uVar9) * iVar2)].bsize
                 = (BLOCK_SIZE)uVar14;
            iVar16 = iVar16 + uVar19;
            uVar14 = ((cpi->common).seq_params)->mib_size;
            uVar7 = (ulong)uVar14;
          } while (iVar16 < (int)uVar14);
        }
        iVar13 = iVar13 + uVar11;
      } while (iVar13 < (int)uVar7);
    }
  }
  else if (0 < (int)uVar15) {
    uVar15 = 0;
    do {
      if (0 < (int)uVar7) {
        iVar18 = (cpi->common).mi_params.mi_stride;
        uVar17 = 0;
        do {
          lVar6 = (long)(int)((int)((uVar17 & 0xffffffff) / (ulong)uVar9) + (uVar15 / uVar9) * iVar2
                             );
          mib[(long)(int)uVar15 * (long)iVar18 + uVar17] = pMVar4 + iVar12 + lVar6;
          pMVar4[iVar12 + lVar6].bsize = bsize;
          uVar17 = uVar17 + (uint)bVar1;
          uVar7 = (ulong)((cpi->common).seq_params)->mib_size;
        } while ((long)uVar17 < (long)uVar7);
      }
      uVar15 = uVar15 + uVar11;
    } while ((int)uVar15 < (int)uVar7);
  }
  return;
}

Assistant:

void av1_set_fixed_partitioning(AV1_COMP *cpi, const TileInfo *const tile,
                                MB_MODE_INFO **mib, int mi_row, int mi_col,
                                BLOCK_SIZE bsize) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_rows_remaining = tile->mi_row_end - mi_row;
  const int mi_cols_remaining = tile->mi_col_end - mi_col;
  MB_MODE_INFO *const mi_upper_left =
      mi_params->mi_alloc + get_alloc_mi_idx(mi_params, mi_row, mi_col);
  int bh = mi_size_high[bsize];
  int bw = mi_size_wide[bsize];

  assert(bsize >= mi_params->mi_alloc_bsize &&
         "Attempted to use bsize < mi_params->mi_alloc_bsize");
  assert((mi_rows_remaining > 0) && (mi_cols_remaining > 0));

  // Apply the requested partition size to the SB if it is all "in image"
  if ((mi_cols_remaining >= cm->seq_params->mib_size) &&
      (mi_rows_remaining >= cm->seq_params->mib_size)) {
    for (int block_row = 0; block_row < cm->seq_params->mib_size;
         block_row += bh) {
      for (int block_col = 0; block_col < cm->seq_params->mib_size;
           block_col += bw) {
        const int grid_index = get_mi_grid_idx(mi_params, block_row, block_col);
        const int mi_index = get_alloc_mi_idx(mi_params, block_row, block_col);
        mib[grid_index] = mi_upper_left + mi_index;
        mib[grid_index]->bsize = bsize;
      }
    }
  } else {
    // Else this is a partial SB.
    set_partial_sb_partition(cm, mi_upper_left, bh, bw, mi_rows_remaining,
                             mi_cols_remaining, bsize, mib);
  }
}